

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

int Curl_FormInit(Form *form,FormData *formdata)

{
  if (formdata != (FormData *)0x0) {
    form->data = formdata;
    form->sent = 0;
    form->fp = (FILE *)0x0;
    form->fread_func = (curl_read_callback)0x0;
    return 0;
  }
  return 1;
}

Assistant:

int Curl_FormInit(struct Form *form, struct FormData *formdata )
{
  if(!formdata)
    return 1; /* error */

  form->data = formdata;
  form->sent = 0;
  form->fp = NULL;
  form->fread_func = ZERO_NULL;

  return 0;
}